

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O3

void compute_response_layer_switch_Dyy_unconditional_opt_naive
               (response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  float *pfVar5;
  bool *pbVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  uint uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  float *pfVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  uint uVar55;
  int iVar56;
  float fVar57;
  
  if (layer->filter_size <= iimage->height) {
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer,iimage);
    return;
  }
  iVar1 = layer->height;
  if (0 < iVar1) {
    pfVar5 = layer->response;
    iVar34 = layer->filter_size;
    iVar2 = layer->step;
    iVar56 = -1;
    iVar24 = 0;
    pbVar6 = layer->laplacian;
    uVar3 = layer->width;
    uVar12 = iVar34 / 3;
    uVar13 = (iVar34 + -1) - (iVar34 + -1 >> 0x1f) >> 1;
    iVar27 = (iVar34 + -1) - uVar13;
    uVar13 = ~uVar13;
    lVar15 = (long)(int)uVar12;
    iVar21 = 0;
    iVar31 = uVar12 - 1;
    uVar29 = ~uVar12;
    iVar23 = -uVar12;
    fVar57 = 1.0 / (float)(iVar34 * iVar34);
    iVar35 = iVar31 - iVar34 / 6;
    uVar16 = ~(iVar34 / 6);
    iVar14 = 0;
    uVar55 = uVar13;
    iVar34 = iVar31;
    uVar20 = uVar12;
    iVar28 = iVar27;
    uVar30 = uVar29;
    iVar36 = iVar35;
    uVar26 = uVar16;
    do {
      if (0 < (int)uVar3) {
        iVar4 = iimage->data_width;
        iVar17 = iVar4 * uVar20;
        iVar53 = iVar4 * uVar30;
        iVar18 = iVar4 * iVar24;
        iVar54 = iVar4 * iVar34;
        iVar19 = iVar4 * iVar56;
        iVar32 = iVar4 * iVar23;
        iVar33 = 0;
        pfVar7 = iimage->data;
        uVar22 = 0;
        pfVar25 = pfVar7;
        do {
          iVar37 = iVar4 * iVar28 + iVar31 + iVar33;
          iVar38 = iVar4 * uVar55 + iVar31 + iVar33;
          auVar11 = vfmadd213ss_fma(ZEXT416((uint)((pfVar7[(int)(uVar16 + iVar32 + iVar33)] -
                                                   pfVar7[(int)(uVar16 + iVar54 + iVar33)]) +
                                                  (pfVar7[iVar35 + iVar54 + iVar33] -
                                                  pfVar7[iVar35 + iVar32 + iVar33]))),
                                    SUB6416(ZEXT464(0xc0400000),0),
                                    ZEXT416((uint)((pfVar7[(int)(iVar32 + uVar13 + iVar33)] -
                                                   pfVar7[(int)(iVar54 + uVar13 + iVar33)]) +
                                                  (pfVar7[iVar27 + iVar54 + iVar33] -
                                                  pfVar7[iVar27 + iVar32 + iVar33]))));
          fVar8 = fVar57 * auVar11._0_4_;
          iVar39 = iVar4 * iVar36 + iVar31 + iVar33;
          iVar40 = iVar4 * uVar26 + iVar31 + iVar33;
          iVar41 = uVar12 + iVar19 + iVar33;
          iVar42 = uVar12 + iVar53 + iVar33;
          iVar43 = iVar18 + uVar29 + iVar33;
          iVar44 = iVar17 + -1 + iVar33;
          iVar45 = iVar17 + uVar29 + iVar33;
          iVar46 = iVar18 + -1 + iVar33;
          iVar47 = uVar29 + iVar53 + iVar33;
          iVar48 = iVar19 + -1 + iVar33;
          iVar49 = iVar19 + uVar29 + iVar33;
          iVar50 = iVar53 + -1 + iVar33;
          iVar51 = uVar12 + iVar17 + iVar33;
          iVar52 = uVar12 + iVar18 + iVar33;
          iVar33 = iVar2 + iVar33;
          auVar11 = vfmadd213ss_fma(ZEXT416((uint)((pfVar7[iVar39] - pfVar7[iVar40]) +
                                                  (pfVar25[(int)(iVar4 * uVar26) - lVar15] -
                                                  pfVar25[iVar4 * iVar36 - lVar15]))),
                                    SUB6416(ZEXT464(0xc0400000),0),
                                    ZEXT416((uint)((pfVar7[iVar37] - pfVar7[iVar38]) +
                                                  (pfVar25[(int)(iVar4 * uVar55) - lVar15] -
                                                  pfVar25[iVar4 * iVar28 - lVar15]))));
          fVar9 = fVar57 * auVar11._0_4_;
          fVar10 = fVar57 * ((((pfVar7[iVar41] - pfVar7[iVar42]) +
                               (pfVar25[iVar53] - pfVar25[iVar19]) +
                              (pfVar7[iVar43] - pfVar7[iVar45]) + (pfVar7[iVar44] - pfVar7[iVar46]))
                             - ((pfVar7[iVar47] - pfVar7[iVar49]) +
                               (pfVar7[iVar48] - pfVar7[iVar50]))) -
                            ((pfVar7[iVar51] - pfVar7[iVar52]) + (pfVar25[iVar18] - pfVar25[iVar17])
                            ));
          auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar10 * -0.81)),ZEXT416((uint)fVar8),
                                    ZEXT416((uint)fVar9));
          pfVar5[(long)iVar21 + uVar22] = auVar11._0_4_;
          pbVar6[uVar22 + (long)iVar21] = 0.0 <= fVar8 + fVar9;
          uVar22 = uVar22 + 1;
          pfVar25 = pfVar25 + iVar2;
        } while (uVar3 != uVar22);
        iVar21 = iVar21 + (int)uVar22;
      }
      iVar14 = iVar14 + 1;
      uVar20 = uVar20 + iVar2;
      iVar24 = iVar24 + iVar2;
      iVar56 = iVar56 + iVar2;
      uVar30 = uVar30 + iVar2;
      iVar34 = iVar34 + iVar2;
      iVar23 = iVar23 + iVar2;
      iVar36 = iVar36 + iVar2;
      uVar26 = uVar26 + iVar2;
      iVar28 = iVar28 + iVar2;
      uVar55 = uVar55 + iVar2;
    } while (iVar14 != iVar1);
  }
  return;
}

Assistant:

void compute_response_layer_switch_Dyy_unconditional_opt_naive(struct response_layer *layer, struct integral_image *iimage) {
    /*
        base function: compute_response_layer_switch_Dyy_unconditional_opt

        optimization:
        - uses compute_response_layer_unconditional for all corner-cases for 32x32, 64x64 image

        notes:
        - intended to check if our corner case optimizations are better or not
    */

    int iheight = iimage->height;
    int filter_size = layer->filter_size;

    // 1. Case The filter is smaller than the image
    if (filter_size <= iheight) {
        // Split the image into 9 cases - corners, borders and middle part.
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

    } else {
        compute_response_layer_unconditional(layer, iimage);
    }
}